

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_chunk_createv(ucvector *out,uint length,char *type,uchar *data)

{
  uint uVar1;
  uchar *in_RAX;
  uchar *chunk;
  uchar *local_28;
  
  local_28 = in_RAX;
  uVar1 = lodepng_chunk_init(&local_28,out,length,type);
  if (uVar1 == 0) {
    lodepng_memcpy(local_28 + 8,data,(ulong)length);
    lodepng_chunk_generate_crc(local_28);
  }
  return uVar1;
}

Assistant:

static unsigned lodepng_chunk_createv(ucvector* out,
                                      unsigned length, const char* type, const unsigned char* data) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, length, type));

  /*3: the data*/
  lodepng_memcpy(chunk + 8, data, length);

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}